

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_deserialize_container
          (t_go_generator *this,ostream *out,t_type *orig_type,bool pointer_field,bool declare,
          string *prefix)

{
  int *piVar1;
  int iVar2;
  t_map *tmap;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  char *pcVar4;
  undefined7 in_register_00000081;
  string *prefix_00;
  string sStack_118;
  undefined4 local_f4;
  string local_f0;
  string eq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_f4 = (undefined4)CONCAT71(in_register_00000009,pointer_field);
  tmap = (t_map *)t_type::get_true_type(orig_type);
  std::__cxx11::string::string((string *)&eq," = ",(allocator *)&sStack_118);
  if ((int)CONCAT71(in_register_00000081,declare) != 0) {
    std::__cxx11::string::assign((char *)&eq);
  }
  iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])(tmap);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])(tmap);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])(tmap);
      if ((char)iVar2 == '\0') {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])(tmap);
        std::operator+(&local_b0,"INVALID TYPE IN generate_deserialize_container \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar2));
        std::operator+(&local_f0,&local_b0,"\' for prefix \'");
        std::operator+(&sStack_118,&local_f0,prefix);
        std::operator+(__return_storage_ptr__,&sStack_118,"\'");
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"_, size, err := iprot.ReadListBegin(ctx)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"if err != nil {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,
                               "  return thrift.PrependError(\"error reading list begin: \", err)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"tSlice := make(");
      type_to_go_type_abi_cxx11_(&local_f0,this,orig_type);
      poVar3 = std::operator<<(poVar3,(string *)&local_f0);
      poVar3 = std::operator<<(poVar3,", 0, size)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,(string *)&eq);
      poVar3 = std::operator<<(poVar3," ");
      pcVar4 = "";
      if ((char)local_f4 != '\0') {
        pcVar4 = "&";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"tSlice");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"_, size, err := iprot.ReadSetBegin(ctx)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"if err != nil {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,
                               "  return thrift.PrependError(\"error reading set begin: \", err)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"tSet := make(");
      type_to_go_type_abi_cxx11_(&local_f0,this,orig_type);
      poVar3 = std::operator<<(poVar3,(string *)&local_f0);
      poVar3 = std::operator<<(poVar3,", 0, size)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,(string *)&eq);
      poVar3 = std::operator<<(poVar3," ");
      pcVar4 = "";
      if ((char)local_f4 != '\0') {
        pcVar4 = "&";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"tSet");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,"_, _, size, err := iprot.ReadMapBegin(ctx)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_118);
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,"if err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_118);
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,
                             "  return thrift.PrependError(\"error reading map begin: \", err)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_118);
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_118);
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,"tMap := make(");
    type_to_go_type_abi_cxx11_(&local_f0,this,orig_type);
    poVar3 = std::operator<<(poVar3,(string *)&local_f0);
    poVar3 = std::operator<<(poVar3,", size)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&sStack_118);
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,(string *)&eq);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "";
    if ((char)local_f4 != '\0') {
      pcVar4 = "&";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"tMap");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&sStack_118);
  t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&sStack_118);
  poVar3 = std::operator<<(poVar3,"for i := 0; i < size; i ++ {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_118);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if ((char)local_f4 != '\0') {
    std::operator+(&local_f0,"(*",prefix);
    std::operator+(&sStack_118,&local_f0,")");
    std::__cxx11::string::operator=((string *)prefix,(string *)&sStack_118);
    std::__cxx11::string::~string((string *)&sStack_118);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])(tmap);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])(tmap);
    if ((char)iVar2 != '\0') {
      prefix_00 = &local_70;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)tmap,false,prefix_00);
      goto LAB_001d3a0f;
    }
    iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])(tmap);
    if ((char)iVar2 != '\0') {
      prefix_00 = &local_90;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_list_element(this,out,(t_list *)tmap,false,prefix_00);
      goto LAB_001d3a0f;
    }
  }
  else {
    prefix_00 = &local_50;
    std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
    generate_deserialize_map_element(this,out,tmap,false,prefix_00);
LAB_001d3a0f:
    std::__cxx11::string::~string((string *)prefix_00);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&sStack_118);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_118);
  iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])(tmap);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])(tmap);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(tmap->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])(tmap);
      if ((char)iVar2 == '\0') goto LAB_001d3ca6;
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"if err := iprot.ReadListEnd(ctx); err != nil {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,
                               "  return thrift.PrependError(\"error reading list end: \", err)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"if err := iprot.ReadSetEnd(ctx); err != nil {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,
                               "  return thrift.PrependError(\"error reading set end: \", err)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_118);
      t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&sStack_118);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,"if err := iprot.ReadMapEnd(ctx); err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_118);
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,"  return thrift.PrependError(\"error reading map end: \", err)"
                            );
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_118);
    t_generator::indent_abi_cxx11_(&sStack_118,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&sStack_118);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&sStack_118);
LAB_001d3ca6:
  std::__cxx11::string::~string((string *)&eq);
  return;
}

Assistant:

void t_go_generator::generate_deserialize_container(ostream& out,
                                                    t_type* orig_type,
                                                    bool pointer_field,
                                                    bool declare,
                                                    string prefix) {
  t_type* ttype = get_true_type(orig_type);
  string eq(" = ");

  if (declare) {
    eq = " := ";
  }

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "_, _, size, err := iprot.ReadMapBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading map begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tMap := make(" << type_to_go_type(orig_type) << ", size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tMap" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "_, size, err := iprot.ReadSetBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading set begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tSet := make(" << type_to_go_type(orig_type) << ", 0, size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tSet" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "_, size, err := iprot.ReadListBegin(ctx)" << endl;
    out << indent() << "if err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading list begin: \", err)" << endl;
    out << indent() << "}" << endl;
    out << indent() << "tSlice := make(" << type_to_go_type(orig_type) << ", 0, size)" << endl;
    out << indent() << prefix << eq << " " << (pointer_field ? "&" : "") << "tSlice" << endl;
  } else {
    throw "INVALID TYPE IN generate_deserialize_container '" + ttype->get_name() + "' for prefix '"
        + prefix + "'";
  }

  // For loop iterates over elements
  out << indent() << "for i := 0; i < size; i ++ {" << endl;
  indent_up();

  if (pointer_field) {
    prefix = "(*" + prefix + ")";
  }
  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, declare, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, declare, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, declare, prefix);
  }

  indent_down();
  out << indent() << "}" << endl;

  // Read container end
  if (ttype->is_map()) {
    out << indent() << "if err := iprot.ReadMapEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading map end: \", err)" << endl;
    out << indent() << "}" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "if err := iprot.ReadSetEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading set end: \", err)" << endl;
    out << indent() << "}" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "if err := iprot.ReadListEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(\"error reading list end: \", err)" << endl;
    out << indent() << "}" << endl;
  }
}